

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleMeshNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  aiMesh **__args;
  pointer *ppuVar1;
  iterator __position;
  pointer puVar2;
  int iVar3;
  aiMesh *paVar4;
  Property *prop;
  DDLNode *this_00;
  string *__k;
  mapped_type_conflict3 *pmVar5;
  Logger *this_01;
  string propKey;
  string propName;
  string local_208;
  string local_1e8;
  char *local_1c8;
  char local_1b8 [16];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a8 [112];
  ios_base local_138 [264];
  
  paVar4 = (aiMesh *)operator_new(0x520);
  paVar4->mPrimitiveTypes = 0;
  paVar4->mNumVertices = 0;
  paVar4->mNumFaces = 0;
  memset(&paVar4->mVertices,0,0xcc);
  paVar4->mBones = (aiBone **)0x0;
  paVar4->mMaterialIndex = 0;
  (paVar4->mName).length = 0;
  (paVar4->mName).data[0] = '\0';
  memset((char *)((long)(paVar4->mName).data + 1),0x1b,0x3ff);
  paVar4->mNumAnimMeshes = 0;
  paVar4->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar4->mMethod = 0;
  (paVar4->mAABB).mMin.x = 0.0;
  *(undefined8 *)((long)&(paVar4->mAABB).mMin + 4) = 0;
  (paVar4->mAABB).mMax.x = 0.0;
  (paVar4->mAABB).mMax.y = 0.0;
  *(float *)((long)&(paVar4->mAABB).mMax + 8) = 0.0;
  paVar4->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar4->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar4->mNumUVComponents[0] = 0;
  paVar4->mNumUVComponents[1] = 0;
  paVar4->mNumUVComponents[2] = 0;
  paVar4->mNumUVComponents[3] = 0;
  paVar4->mNumUVComponents[4] = 0;
  paVar4->mNumUVComponents[5] = 0;
  paVar4->mNumUVComponents[6] = 0;
  paVar4->mNumUVComponents[7] = 0;
  paVar4->mColors[0] = (aiColor4D *)0x0;
  paVar4->mColors[1] = (aiColor4D *)0x0;
  paVar4->mColors[2] = (aiColor4D *)0x0;
  paVar4->mColors[3] = (aiColor4D *)0x0;
  paVar4->mColors[4] = (aiColor4D *)0x0;
  paVar4->mColors[5] = (aiColor4D *)0x0;
  paVar4->mColors[6] = (aiColor4D *)0x0;
  paVar4->mColors[7] = (aiColor4D *)0x0;
  __args = &this->m_currentMesh;
  this->m_currentMesh = paVar4;
  __position._M_current =
       (this->m_meshCache).
       super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->m_meshCache).
           super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current ==
      (this->m_meshCache).
      super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
    ::_M_realloc_insert<aiMesh*&>
              ((vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
                *)&this->m_meshCache,__position,__args);
  }
  else {
    ((__position._M_current)->_M_t).super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t
    .super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl = paVar4;
    ppuVar1 = &(this->m_meshCache).
               super__Vector_base<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  prop = ODDLParser::DDLNode::getProperties(node);
  if (prop != (Property *)0x0) {
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    propId2StdString(prop,&local_1e8,&local_208);
    iVar3 = std::__cxx11::string::compare((char *)&local_1e8);
    if (iVar3 == 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_208);
      if (iVar3 == 0) {
        (*__args)->mPrimitiveTypes = (*__args)->mPrimitiveTypes | 1;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_208);
        if (iVar3 == 0) {
          (*__args)->mPrimitiveTypes = (*__args)->mPrimitiveTypes | 2;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_208);
          if (iVar3 == 0) {
            (*__args)->mPrimitiveTypes = (*__args)->mPrimitiveTypes | 4;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_208);
            if (iVar3 == 0) {
              (*__args)->mPrimitiveTypes = (*__args)->mPrimitiveTypes | 8;
            }
            else {
              this_01 = DefaultLogger::get();
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              basic_formatter<std::__cxx11::string>(local_1a8,&local_208);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8," is not supported primitive type.",0x21);
              std::__cxx11::stringbuf::str();
              Logger::warn(this_01,local_1c8);
              if (local_1c8 != local_1b8) {
                operator_delete(local_1c8);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
  }
  handleNodes(this,node,pScene);
  this_00 = ODDLParser::DDLNode::getParent(node);
  if (this_00 != (DDLNode *)0x0) {
    __k = ODDLParser::DDLNode::getName_abi_cxx11_(this_00);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->m_mesh2refMap,__k);
    *pmVar5 = (long)__position._M_current - (long)puVar2 >> 3;
  }
  return;
}

Assistant:

void OpenGEXImporter::handleMeshNode( ODDLParser::DDLNode *node, aiScene *pScene ) {
    m_currentMesh = new aiMesh;
    const size_t meshidx( m_meshCache.size() );
    // ownership is transferred but a reference remains in m_currentMesh
    m_meshCache.emplace_back( m_currentMesh );

    Property *prop = node->getProperties();
    if( nullptr != prop ) {
        std::string propName, propKey;
        propId2StdString( prop, propName, propKey );
        if( "primitive" == propName ) {
            if ( "points" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
            } else if ( "lines" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
            } else if( "triangles" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
            } else if ( "quads" == propKey ) {
                m_currentMesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
            } else {
                ASSIMP_LOG_WARN_F( propKey, " is not supported primitive type." );
            }
        }
    }

    handleNodes( node, pScene );

    DDLNode *parent( node->getParent() );
    if( nullptr != parent ) {
        const std::string &name = parent->getName();
        m_mesh2refMap[ name ] = meshidx;
    }
}